

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O0

void VP8LHistogramAdd(VP8LHistogram *a,VP8LHistogram *b,VP8LHistogram *out)

{
  int iVar1;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int literal_size;
  int i;
  int local_1c;
  
  iVar1 = VP8LHistogramNumCodes(*(int *)(in_RDI + 0x195));
  if (in_RSI == in_RDX) {
    if (*(char *)(in_RDI + 0x19a) != '\0') {
      if (*(char *)(in_RDX + 0x19a) == '\0') {
        memcpy((void *)*in_RDX,(void *)*in_RDI,(long)iVar1 << 2);
      }
      else {
        (*VP8LAddVectorEq)((uint32_t *)*in_RDI,(uint32_t *)*in_RDX,iVar1);
      }
    }
    if (*(char *)((long)in_RDI + 0xcd1) != '\0') {
      if (*(char *)((long)in_RDX + 0xcd1) == '\0') {
        memcpy(in_RDX + 1,in_RDI + 1,0x400);
      }
      else {
        (*VP8LAddVectorEq)((uint32_t *)(in_RDI + 1),(uint32_t *)(in_RDX + 1),0x100);
      }
    }
    if (*(char *)((long)in_RDI + 0xcd2) != '\0') {
      if (*(char *)((long)in_RDX + 0xcd2) == '\0') {
        memcpy(in_RDX + 0x81,in_RDI + 0x81,0x400);
      }
      else {
        (*VP8LAddVectorEq)((uint32_t *)(in_RDI + 0x81),(uint32_t *)(in_RDX + 0x81),0x100);
      }
    }
    if (*(char *)((long)in_RDI + 0xcd3) != '\0') {
      if (*(char *)((long)in_RDX + 0xcd3) == '\0') {
        memcpy(in_RDX + 0x101,in_RDI + 0x101,0x400);
      }
      else {
        (*VP8LAddVectorEq)((uint32_t *)(in_RDI + 0x101),(uint32_t *)(in_RDX + 0x101),0x100);
      }
    }
    if (*(char *)((long)in_RDI + 0xcd4) != '\0') {
      if (*(char *)((long)in_RDX + 0xcd4) == '\0') {
        memcpy(in_RDX + 0x181,in_RDI + 0x181,0xa0);
      }
      else {
        (*VP8LAddVectorEq)((uint32_t *)(in_RDI + 0x181),(uint32_t *)(in_RDX + 0x181),0x28);
      }
    }
    for (local_1c = 0; local_1c < 5; local_1c = local_1c + 1) {
      *(byte *)((long)in_RDX + (long)local_1c + 0xcd0) =
           *(byte *)((long)in_RDX + (long)local_1c + 0xcd0) |
           *(byte *)((long)in_RDI + (long)local_1c + 0xcd0);
    }
  }
  else {
    if (*(char *)(in_RDI + 0x19a) == '\0') {
      if (*(char *)(in_RSI + 0x19a) == '\0') {
        memset((void *)*in_RDX,0,(long)iVar1 << 2);
      }
      else {
        memcpy((void *)*in_RDX,(void *)*in_RSI,(long)iVar1 << 2);
      }
    }
    else if (*(char *)(in_RSI + 0x19a) == '\0') {
      memcpy((void *)*in_RDX,(void *)*in_RDI,(long)iVar1 << 2);
    }
    else {
      (*VP8LAddVector)((uint32_t *)*in_RDI,(uint32_t *)*in_RSI,(uint32_t *)*in_RDX,iVar1);
    }
    if (*(char *)((long)in_RDI + 0xcd1) == '\0') {
      if (*(char *)((long)in_RSI + 0xcd1) == '\0') {
        memset(in_RDX + 1,0,0x400);
      }
      else {
        memcpy(in_RDX + 1,in_RSI + 1,0x400);
      }
    }
    else if (*(char *)((long)in_RSI + 0xcd1) == '\0') {
      memcpy(in_RDX + 1,in_RDI + 1,0x400);
    }
    else {
      (*VP8LAddVector)((uint32_t *)(in_RDI + 1),(uint32_t *)(in_RSI + 1),(uint32_t *)(in_RDX + 1),
                       0x100);
    }
    if (*(char *)((long)in_RDI + 0xcd2) == '\0') {
      if (*(char *)((long)in_RSI + 0xcd2) == '\0') {
        memset(in_RDX + 0x81,0,0x400);
      }
      else {
        memcpy(in_RDX + 0x81,in_RSI + 0x81,0x400);
      }
    }
    else if (*(char *)((long)in_RSI + 0xcd2) == '\0') {
      memcpy(in_RDX + 0x81,in_RDI + 0x81,0x400);
    }
    else {
      (*VP8LAddVector)((uint32_t *)(in_RDI + 0x81),(uint32_t *)(in_RSI + 0x81),
                       (uint32_t *)(in_RDX + 0x81),0x100);
    }
    if (*(char *)((long)in_RDI + 0xcd3) == '\0') {
      if (*(char *)((long)in_RSI + 0xcd3) == '\0') {
        memset(in_RDX + 0x101,0,0x400);
      }
      else {
        memcpy(in_RDX + 0x101,in_RSI + 0x101,0x400);
      }
    }
    else if (*(char *)((long)in_RSI + 0xcd3) == '\0') {
      memcpy(in_RDX + 0x101,in_RDI + 0x101,0x400);
    }
    else {
      (*VP8LAddVector)((uint32_t *)(in_RDI + 0x101),(uint32_t *)(in_RSI + 0x101),
                       (uint32_t *)(in_RDX + 0x101),0x100);
    }
    if (*(char *)((long)in_RDI + 0xcd4) == '\0') {
      if (*(char *)((long)in_RSI + 0xcd4) == '\0') {
        memset(in_RDX + 0x181,0,0xa0);
      }
      else {
        memcpy(in_RDX + 0x181,in_RSI + 0x181,0xa0);
      }
    }
    else if (*(char *)((long)in_RSI + 0xcd4) == '\0') {
      memcpy(in_RDX + 0x181,in_RDI + 0x181,0xa0);
    }
    else {
      (*VP8LAddVector)((uint32_t *)(in_RDI + 0x181),(uint32_t *)(in_RSI + 0x181),
                       (uint32_t *)(in_RDX + 0x181),0x28);
    }
    for (local_1c = 0; local_1c < 5; local_1c = local_1c + 1) {
      *(byte *)((long)in_RDX + (long)local_1c + 0xcd0) =
           *(byte *)((long)in_RDI + (long)local_1c + 0xcd0) |
           *(byte *)((long)in_RSI + (long)local_1c + 0xcd0);
    }
  }
  return;
}

Assistant:

void VP8LHistogramAdd(const VP8LHistogram* WEBP_RESTRICT const a,
                      const VP8LHistogram* WEBP_RESTRICT const b,
                      VP8LHistogram* WEBP_RESTRICT const out) {
  int i;
  const int literal_size = VP8LHistogramNumCodes(a->palette_code_bits_);
  assert(a->palette_code_bits_ == b->palette_code_bits_);

  if (b != out) {
    ADD(0, literal_, literal_size);
    ADD(1, red_, NUM_LITERAL_CODES);
    ADD(2, blue_, NUM_LITERAL_CODES);
    ADD(3, alpha_, NUM_LITERAL_CODES);
    ADD(4, distance_, NUM_DISTANCE_CODES);
    for (i = 0; i < 5; ++i) {
      out->is_used_[i] = (a->is_used_[i] | b->is_used_[i]);
    }
  } else {
    ADD_EQ(0, literal_, literal_size);
    ADD_EQ(1, red_, NUM_LITERAL_CODES);
    ADD_EQ(2, blue_, NUM_LITERAL_CODES);
    ADD_EQ(3, alpha_, NUM_LITERAL_CODES);
    ADD_EQ(4, distance_, NUM_DISTANCE_CODES);
    for (i = 0; i < 5; ++i) out->is_used_[i] |= a->is_used_[i];
  }
}